

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O0

void __thiscall icu_63::UVector32::sortedInsert(UVector32 *this,int32_t tok,UErrorCode *ec)

{
  UBool UVar1;
  int32_t iVar2;
  int local_30;
  int32_t i;
  int32_t probe;
  int32_t max;
  int32_t min;
  UErrorCode *ec_local;
  int32_t tok_local;
  UVector32 *this_local;
  
  probe = 0;
  iVar2 = this->count;
  while (i = iVar2, probe != i) {
    iVar2 = (probe + i) / 2;
    if (this->elements[iVar2] <= tok) {
      probe = iVar2 + 1;
      iVar2 = i;
    }
  }
  UVar1 = ensureCapacity(this,this->count + 1,ec);
  if (UVar1 != '\0') {
    for (local_30 = this->count; probe < local_30; local_30 = local_30 + -1) {
      this->elements[local_30] = this->elements[local_30 + -1];
    }
    this->elements[probe] = tok;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector32::sortedInsert(int32_t tok, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        //int8_t c = (*compare)(elements[probe], tok);
        //if (c > 0) {
        if (elements[probe] > tok) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = tok;
        ++count;
    }
}